

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_new(lua_State *L,char *str)

{
  global_State *pgVar1;
  int iVar2;
  size_t l;
  TString *pTVar3;
  uint uVar4;
  undefined8 *puVar5;
  long lVar6;
  
  lVar6 = 0;
  pgVar1 = L->l_G;
  uVar4 = (int)(((ulong)str & 0xffffffff) % 0x35) << 4;
  puVar5 = (undefined8 *)((long)pgVar1->strcache[0] + (ulong)uVar4);
  do {
    if (lVar6 == 2) {
      *(undefined8 *)((long)pgVar1->strcache[0] + (ulong)uVar4 + 8) = *puVar5;
      l = strlen(str);
      pTVar3 = luaS_newlstr(L,str,l);
      *puVar5 = pTVar3;
      return pTVar3;
    }
    pTVar3 = (TString *)puVar5[lVar6];
    iVar2 = strcmp(str,(char *)(pTVar3 + 1));
    lVar6 = lVar6 + 1;
  } while (iVar2 != 0);
  return pTVar3;
}

Assistant:

TString *luaS_new(lua_State *L, const char *str) {
    unsigned int i = point2uint(str) % STRCACHE_N;  /* hash */
    int j;
    TString **p = G(L)->strcache[i];
    for (j = 0; j < STRCACHE_M; j++) {
        if (strcmp(str, getstr(p[j])) == 0)  /* hit? */
            return p[j];  /* that is it */
    }
    /* normal route */
    for (j = STRCACHE_M - 1; j > 0; j--)
        p[j] = p[j - 1];  /* move out last element */
    /* new element is first in the list */
    p[0] = luaS_newlstr(L, str, strlen(str));
    return p[0];
}